

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::LoadLWO2TextureBlock(LWOImporter *this,SubChunkHeader *head,uint size)

{
  uint32_t uVar1;
  bool bVar2;
  uint size_00;
  int iVar3;
  Logger *this_00;
  char *__s1;
  char *__s2;
  const_iterator local_f8;
  _Self local_f0;
  _Self local_e8;
  iterator it;
  list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *local_d8;
  TextureList *listRef;
  undefined1 local_c0 [8];
  Texture tex;
  Surface *surf;
  uint size_local;
  SubChunkHeader *head_local;
  LWOImporter *this_local;
  
  bVar2 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::empty
                    (this->mSurfaces);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!mSurfaces->empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x270,
                  "void Assimp::LWOImporter::LoadLWO2TextureBlock(IFF::SubChunkHeader *, unsigned int)"
                 );
  }
  tex.ordinal.field_2._8_8_ =
       std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::back
                 (this->mSurfaces);
  LWO::Texture::Texture((Texture *)local_c0);
  LoadLWO2TextureHeader(this,(uint)head->length,(Texture *)local_c0);
  size_00 = (size - head->length) - 6;
  uVar1 = head->type;
  if (uVar1 == 0x47524144) {
    LoadLWO2Gradient(this,size_00,(Texture *)local_c0);
  }
  else if (uVar1 == 0x494d4150) {
    LoadLWO2ImageMap(this,size_00,(Texture *)local_c0);
  }
  else if (uVar1 == 0x50524f43) {
    LoadLWO2Procedural(this,size_00,(Texture *)local_c0);
  }
  if (tex.mClipIdx == 0x42554d50) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0xf0);
  }
  else if (tex.mClipIdx == 0x434f4c52) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0x90);
  }
  else if (tex.mClipIdx == 0x44494646) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0xa8);
  }
  else if (tex.mClipIdx == 0x474c4f53) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0x108);
  }
  else if (tex.mClipIdx == 0x5245464c) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0x120);
  }
  else if (tex.mClipIdx == 0x53504543) {
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0xc0);
  }
  else {
    if (tex.mClipIdx != 0x5452414e) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"LWO2: Encountered unknown texture type");
      it._M_node._4_4_ = 1;
      goto LAB_006da0bb;
    }
    local_d8 = (list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
               (tex.ordinal.field_2._8_8_ + 0xd8);
  }
  local_e8._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::begin
                 (local_d8);
  while( true ) {
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::end
                   (local_d8);
    bVar2 = std::operator!=(&local_e8,&local_f0);
    if (!bVar2) break;
    __s1 = (char *)std::__cxx11::string::c_str();
    std::_List_iterator<Assimp::LWO::Texture>::operator*(&local_e8);
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar3 = strcmp(__s1,__s2);
    if (iVar3 < 0) {
      std::_List_const_iterator<Assimp::LWO::Texture>::_List_const_iterator(&local_f8,&local_e8);
      std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::insert
                (local_d8,local_f8,(value_type *)local_c0);
      it._M_node._4_4_ = 1;
      goto LAB_006da0bb;
    }
    std::_List_iterator<Assimp::LWO::Texture>::operator++(&local_e8);
  }
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::push_back
            (local_d8,(value_type *)local_c0);
  it._M_node._4_4_ = 0;
LAB_006da0bb:
  LWO::Texture::~Texture((Texture *)local_c0);
  return;
}

Assistant:

void LWOImporter::LoadLWO2TextureBlock(LE_NCONST IFF::SubChunkHeader* head, unsigned int size )
{
    ai_assert(!mSurfaces->empty());
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture tex;

    // load the texture header
    LoadLWO2TextureHeader(head->length,tex);
    size -= head->length + 6;

    // now get the exact type of the texture
    switch (head->type)
    {
    case AI_LWO_PROC:
        LoadLWO2Procedural(size,tex);
        break;
    case AI_LWO_GRAD:
        LoadLWO2Gradient(size,tex);
        break;
    case AI_LWO_IMAP:
        LoadLWO2ImageMap(size,tex);
    }

    // get the destination channel
    TextureList* listRef = NULL;
    switch (tex.type)
    {
    case AI_LWO_COLR:
        listRef = &surf.mColorTextures;break;
    case AI_LWO_DIFF:
        listRef = &surf.mDiffuseTextures;break;
    case AI_LWO_SPEC:
        listRef = &surf.mSpecularTextures;break;
    case AI_LWO_GLOS:
        listRef = &surf.mGlossinessTextures;break;
    case AI_LWO_BUMP:
        listRef = &surf.mBumpTextures;break;
    case AI_LWO_TRAN:
        listRef = &surf.mOpacityTextures;break;
    case AI_LWO_REFL:
        listRef = &surf.mReflectionTextures;break;
    default:
        ASSIMP_LOG_WARN("LWO2: Encountered unknown texture type");
        return;
    }

    // now attach the texture to the parent surface - sort by ordinal string
    for (TextureList::iterator it = listRef->begin();it != listRef->end(); ++it)    {
        if (::strcmp(tex.ordinal.c_str(),(*it).ordinal.c_str()) < 0)    {
            listRef->insert(it,tex);
            return;
        }
    }
    listRef->push_back(tex);
}